

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureFilteringTests.cpp
# Opt level: O2

int __thiscall
deqp::gles31::Functional::TextureFilteringTests::init(TextureFilteringTests *this,EVP_PKEY_CTX *ctx)

{
  deUint32 minFilter;
  deUint32 magFilter;
  TestNode *pTVar1;
  TestNode *node;
  TextureCubeArrayFilteringCase *pTVar2;
  ulong uVar3;
  char *pcVar4;
  long lVar5;
  long lVar6;
  int iVar7;
  uint uVar8;
  long lVar9;
  pointer ppTVar10;
  int size;
  pointer local_1c0;
  ulong local_1b8;
  TestNode *local_1b0;
  ulong local_1a8;
  int depth;
  TestNode *local_198;
  char *local_190;
  TestNode *local_188;
  anon_struct_16_2_3f8b7511 *local_180;
  deUint32 local_174;
  string name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  string local_50;
  
  pTVar1 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar1,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"cube_array",
             "Cube Map Array Texture Filtering");
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  node = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)node,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"formats",
             "Cube Map Array Texture Formats");
  local_1b0 = node;
  local_198 = pTVar1;
  tcu::TestNode::addChild(pTVar1,node);
  uVar3 = 0;
  while (uVar3 != 10) {
    local_1a8 = (ulong)init::filterableFormatsByType[uVar3].format;
    local_1c0 = (pointer)init::filterableFormatsByType[uVar3].name;
    local_1b8 = uVar3;
    for (lVar9 = 8; lVar9 != 0x68; lVar9 = lVar9 + 0x10) {
      minFilter = *(deUint32 *)((long)&init::minFilterModes[0].name + lVar9);
      pcVar4 = *(char **)((long)&init::wrapModes[2].mode + lVar9);
      magFilter = minFilter;
      if (minFilter - 0x2602 < 0xfffffffe) {
        magFilter = 0x2601;
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_f0,(char *)local_1c0,(allocator<char> *)&local_130);
      std::operator+(&local_d0,&local_f0,"_");
      std::operator+(&name,&local_d0,pcVar4);
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_f0);
      pTVar2 = (TextureCubeArrayFilteringCase *)operator_new(0x120);
      TextureCubeArrayFilteringCase::TextureCubeArrayFilteringCase
                (pTVar2,(this->super_TestCaseGroup).m_context,name._M_dataplus._M_p,
                 glcts::fixed_sample_locations_values + 1,minFilter,magFilter,0x2901,0x2901,
                 (deUint32)local_1a8,0x40,0xc,false);
      tcu::TestNode::addChild(local_1b0,(TestNode *)pTVar2);
      std::__cxx11::string::~string((string *)&name);
    }
    uVar3 = local_1b8 + 1;
  }
  pTVar1 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar1,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"sizes",
             "Texture Sizes");
  local_188 = pTVar1;
  tcu::TestNode::addChild(local_198,pTVar1);
  pcVar4 = (char *)0x0;
  while (pcVar4 != (char *)0x5) {
    local_1b8 = CONCAT44(local_1b8._4_4_,init::sizesCubeArray[(long)pcVar4].size);
    local_180 = (anon_struct_16_2_3f8b7511 *)
                CONCAT44(local_180._4_4_,init::sizesCubeArray[(long)pcVar4].depth);
    pTVar1 = (TestNode *)0x8;
    local_190 = pcVar4;
    while (pTVar1 != (TestNode *)0x68) {
      uVar8 = *(uint *)&pTVar1[0x45571].m_children.
                        super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
                        _M_impl.super__Vector_impl_data._M_finish;
      local_1a8 = (ulong)uVar8;
      local_1c0 = pTVar1[0x45571].m_children.
                  super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
      if (uVar8 - 0x2602 < 0xfffffffe) {
        uVar8 = 0x2601;
      }
      size = (int)local_1b8;
      depth = (int)local_180;
      local_1b0 = pTVar1;
      de::toString<int>(&local_b0,&size);
      std::operator+(&local_110,&local_b0,"x");
      de::toString<int>(&local_50,&size);
      std::operator+(&local_90,&local_110,&local_50);
      std::operator+(&local_130,&local_90,"x");
      de::toString<int>(&local_70,&depth);
      std::operator+(&local_f0,&local_130,&local_70);
      std::operator+(&local_d0,&local_f0,"_");
      std::operator+(&name,&local_d0,(char *)local_1c0);
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_f0);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_130);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_110);
      std::__cxx11::string::~string((string *)&local_b0);
      pTVar2 = (TextureCubeArrayFilteringCase *)operator_new(0x120);
      TextureCubeArrayFilteringCase::TextureCubeArrayFilteringCase
                (pTVar2,(this->super_TestCaseGroup).m_context,name._M_dataplus._M_p,
                 glcts::fixed_sample_locations_values + 1,(deUint32)local_1a8,uVar8,0x2901,0x2901,
                 0x8058,size,depth,false);
      tcu::TestNode::addChild(local_188,(TestNode *)pTVar2);
      std::__cxx11::string::~string((string *)&name);
      pTVar1 = (TestNode *)&local_1b0->m_name;
    }
    pcVar4 = local_190 + 1;
  }
  pTVar1 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar1,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"combinations"
             ,"Filter and wrap mode combinations");
  tcu::TestNode::addChild(local_198,pTVar1);
  for (lVar9 = 0; lVar9 != 6; lVar9 = lVar9 + 1) {
    local_174 = init::minFilterModes[lVar9].mode;
    local_190 = init::minFilterModes[lVar9].name;
    for (lVar6 = 0; lVar6 != 2; lVar6 = lVar6 + 1) {
      local_180 = init::magFilterModes + lVar6;
      local_188 = (TestNode *)CONCAT44(local_188._4_4_,init::magFilterModes[lVar6].mode);
      for (lVar5 = 0; lVar5 != 3; lVar5 = lVar5 + 1) {
        local_1b0 = (TestNode *)(init::wrapModes + lVar5);
        local_1b8 = (ulong)init::wrapModes[lVar5].mode;
        ppTVar10 = (pointer)0x8;
        while( true ) {
          if (ppTVar10 == (pointer)&DAT_00000038) break;
          uVar8 = *(uint *)(ppTVar10 + 0x3cac34);
          local_1c0 = ppTVar10;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_b0,local_190,(allocator<char> *)&local_50);
          std::operator+(&local_110,&local_b0,"_");
          local_1a8 = (ulong)uVar8;
          std::operator+(&local_90,&local_110,local_180->name);
          std::operator+(&local_130,&local_90,"_");
          std::operator+(&local_f0,&local_130,(char *)local_1b0->_vptr_TestNode);
          std::operator+(&local_d0,&local_f0,"_");
          std::operator+(&name,&local_d0,(char *)local_1c0[0x3cac33]);
          std::__cxx11::string::~string((string *)&local_d0);
          std::__cxx11::string::~string((string *)&local_f0);
          std::__cxx11::string::~string((string *)&local_130);
          std::__cxx11::string::~string((string *)&local_90);
          std::__cxx11::string::~string((string *)&local_110);
          std::__cxx11::string::~string((string *)&local_b0);
          pTVar2 = (TextureCubeArrayFilteringCase *)operator_new(0x120);
          TextureCubeArrayFilteringCase::TextureCubeArrayFilteringCase
                    (pTVar2,(this->super_TestCaseGroup).m_context,name._M_dataplus._M_p,
                     glcts::fixed_sample_locations_values + 1,local_174,(deUint32)local_188,
                     (deUint32)local_1b8,(deUint32)local_1a8,0x8058,0x3f,0xc,false);
          tcu::TestNode::addChild(pTVar1,(TestNode *)pTVar2);
          std::__cxx11::string::~string((string *)&name);
          ppTVar10 = local_1c0 + 2;
        }
      }
    }
  }
  pTVar1 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar1,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "no_edges_visible","Don\'t sample anywhere near a face\'s edges");
  tcu::TestNode::addChild(local_198,pTVar1);
  iVar7 = 2;
  while( true ) {
    if (iVar7 == 0) break;
    pcVar4 = "linear_mipmap_linear";
    if (iVar7 == 2) {
      pcVar4 = "linear_mipmap_nearest";
    }
    uVar8 = iVar7 == 2 ^ 0x2601;
    pTVar2 = (TextureCubeArrayFilteringCase *)operator_new(0x120);
    TextureCubeArrayFilteringCase::TextureCubeArrayFilteringCase
              (pTVar2,(this->super_TestCaseGroup).m_context,pcVar4 + 0xe,
               glcts::fixed_sample_locations_values + 1,uVar8,uVar8,0x2901,0x2901,0x8058,0x3f,0xc,
               true);
    tcu::TestNode::addChild(pTVar1,(TestNode *)pTVar2);
    iVar7 = iVar7 + -1;
  }
  return iVar7;
}

Assistant:

void TextureFilteringTests::init (void)
{
	static const struct
	{
		const char*		name;
		deUint32		mode;
	} wrapModes[] =
	{
		{ "clamp",		GL_CLAMP_TO_EDGE },
		{ "repeat",		GL_REPEAT },
		{ "mirror",		GL_MIRRORED_REPEAT }
	};

	static const struct
	{
		const char*		name;
		deUint32		mode;
	} minFilterModes[] =
	{
		{ "nearest",				GL_NEAREST					},
		{ "linear",					GL_LINEAR					},
		{ "nearest_mipmap_nearest",	GL_NEAREST_MIPMAP_NEAREST	},
		{ "linear_mipmap_nearest",	GL_LINEAR_MIPMAP_NEAREST	},
		{ "nearest_mipmap_linear",	GL_NEAREST_MIPMAP_LINEAR	},
		{ "linear_mipmap_linear",	GL_LINEAR_MIPMAP_LINEAR		}
	};

	static const struct
	{
		const char*		name;
		deUint32		mode;
	} magFilterModes[] =
	{
		{ "nearest",	GL_NEAREST },
		{ "linear",		GL_LINEAR }
	};

	static const struct
	{
		int size;
		int depth;
	} sizesCubeArray[] =
	{
		{   8,	 6 },
		{  64,	12 },
		{ 128,	12 },
		{   7,	12 },
		{  63,	18 }
	};

	static const struct
	{
		const char*		name;
		deUint32		format;
	} filterableFormatsByType[] =
	{
		{ "rgba16f",		GL_RGBA16F			},
		{ "r11f_g11f_b10f",	GL_R11F_G11F_B10F	},
		{ "rgb9_e5",		GL_RGB9_E5			},
		{ "rgba8",			GL_RGBA8			},
		{ "rgba8_snorm",	GL_RGBA8_SNORM		},
		{ "rgb565",			GL_RGB565			},
		{ "rgba4",			GL_RGBA4			},
		{ "rgb5_a1",		GL_RGB5_A1			},
		{ "srgb8_alpha8",	GL_SRGB8_ALPHA8		},
		{ "rgb10_a2",		GL_RGB10_A2			}
	};

	// Cube map array texture filtering.
	{
		tcu::TestCaseGroup* const groupCubeArray = new tcu::TestCaseGroup(m_testCtx, "cube_array", "Cube Map Array Texture Filtering");
		addChild(groupCubeArray);

		// Formats.
		{
			tcu::TestCaseGroup* const formatsGroup = new tcu::TestCaseGroup(m_testCtx, "formats", "Cube Map Array Texture Formats");
			groupCubeArray->addChild(formatsGroup);

			for (int fmtNdx = 0; fmtNdx < DE_LENGTH_OF_ARRAY(filterableFormatsByType); fmtNdx++)
			{
				for (int filterNdx = 0; filterNdx < DE_LENGTH_OF_ARRAY(minFilterModes); filterNdx++)
				{
					const deUint32	minFilter	= minFilterModes[filterNdx].mode;
					const char*		filterName	= minFilterModes[filterNdx].name;
					const deUint32	format		= filterableFormatsByType[fmtNdx].format;
					const char*		formatName	= filterableFormatsByType[fmtNdx].name;
					const bool		isMipmap	= minFilter != GL_NEAREST && minFilter != GL_LINEAR;
					const deUint32	magFilter	= isMipmap ? GL_LINEAR : minFilter;
					const string	name		= string(formatName) + "_" + filterName;
					const deUint32	wrapS		= GL_REPEAT;
					const deUint32	wrapT		= GL_REPEAT;
					const int		size		= 64;
					const int		depth		= 12;

					formatsGroup->addChild(new TextureCubeArrayFilteringCase(m_context,
																			 name.c_str(), "",
																			 minFilter, magFilter,
																			 wrapS, wrapT,
																			 format,
																			 size, depth));
				}
			}
		}

		// Sizes.
		{
			tcu::TestCaseGroup* const sizesGroup = new tcu::TestCaseGroup(m_testCtx, "sizes", "Texture Sizes");
			groupCubeArray->addChild(sizesGroup);

			for (int sizeNdx = 0; sizeNdx < DE_LENGTH_OF_ARRAY(sizesCubeArray); sizeNdx++)
			{
				for (int filterNdx = 0; filterNdx < DE_LENGTH_OF_ARRAY(minFilterModes); filterNdx++)
				{
					const deUint32	minFilter	= minFilterModes[filterNdx].mode;
					const char*		filterName	= minFilterModes[filterNdx].name;
					const deUint32	format		= GL_RGBA8;
					const bool		isMipmap	= minFilter != GL_NEAREST && minFilter != GL_LINEAR;
					const deUint32	magFilter	= isMipmap ? GL_LINEAR : minFilter;
					const deUint32	wrapS		= GL_REPEAT;
					const deUint32	wrapT		= GL_REPEAT;
					const int		size		= sizesCubeArray[sizeNdx].size;
					const int		depth		= sizesCubeArray[sizeNdx].depth;
					const string	name		= de::toString(size) + "x" + de::toString(size) + "x" + de::toString(depth) + "_" + filterName;

					sizesGroup->addChild(new TextureCubeArrayFilteringCase(m_context,
																		   name.c_str(), "",
																		   minFilter, magFilter,
																		   wrapS, wrapT,
																		   format,
																		   size, depth));
				}
			}
		}

		// Wrap modes.
		{
			tcu::TestCaseGroup* const combinationsGroup = new tcu::TestCaseGroup(m_testCtx, "combinations", "Filter and wrap mode combinations");
			groupCubeArray->addChild(combinationsGroup);

			for (int minFilterNdx = 0; minFilterNdx < DE_LENGTH_OF_ARRAY(minFilterModes); minFilterNdx++)
			{
				for (int magFilterNdx = 0; magFilterNdx < DE_LENGTH_OF_ARRAY(magFilterModes); magFilterNdx++)
				{
					for (int wrapSNdx = 0; wrapSNdx < DE_LENGTH_OF_ARRAY(wrapModes); wrapSNdx++)
					{
						for (int wrapTNdx = 0; wrapTNdx < DE_LENGTH_OF_ARRAY(wrapModes); wrapTNdx++)
						{
							const deUint32	minFilter	= minFilterModes[minFilterNdx].mode;
							const deUint32	magFilter	= magFilterModes[magFilterNdx].mode;
							const deUint32	format		= GL_RGBA8;
							const deUint32	wrapS		= wrapModes[wrapSNdx].mode;
							const deUint32	wrapT		= wrapModes[wrapTNdx].mode;
							const int		size		= 63;
							const int		depth		= 12;
							const string	name		= string(minFilterModes[minFilterNdx].name) + "_" + magFilterModes[magFilterNdx].name + "_" + wrapModes[wrapSNdx].name + "_" + wrapModes[wrapTNdx].name;

							combinationsGroup->addChild(new TextureCubeArrayFilteringCase(m_context,
																						  name.c_str(), "",
																						  minFilter, magFilter,
																						  wrapS, wrapT,
																						  format,
																						  size, depth));
						}
					}
				}
			}
		}

		// Cases with no visible cube edges.
		{
			tcu::TestCaseGroup* const onlyFaceInteriorGroup = new tcu::TestCaseGroup(m_testCtx, "no_edges_visible", "Don't sample anywhere near a face's edges");
			groupCubeArray->addChild(onlyFaceInteriorGroup);

			for (int isLinearI = 0; isLinearI <= 1; isLinearI++)
			{
				const bool		isLinear	= isLinearI != 0;
				const deUint32	filter		= isLinear ? GL_LINEAR : GL_NEAREST;

				onlyFaceInteriorGroup->addChild(new TextureCubeArrayFilteringCase(m_context,
																				  isLinear ? "linear" : "nearest", "",
																				  filter, filter,
																				  GL_REPEAT, GL_REPEAT,
																				  GL_RGBA8,
																				  63, 12,
																				  true));
			}
		}
	}
}